

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RamFileManager.cpp
# Opt level: O2

const_iterator * __thiscall
supermap::io::RamFileManager::getFileIterator
          (const_iterator *__return_storage_ptr__,RamFileManager *this,path *file)

{
  FileException *this_00;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  getFileIteratorNoThrow(__return_storage_ptr__,this,file);
  if (__return_storage_ptr__->_M_cur != *(_Elt_pointer *)&this->field_0x38) {
    return __return_storage_ptr__;
  }
  this_00 = (FileException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_40,(string *)file);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Not found",&local_61);
  FileException::FileException(this_00,&local_40,&local_60);
  __cxa_throw(this_00,&FileException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::deque<RamFileManager::File>::const_iterator RamFileManager::getFileIterator(
    const std::filesystem::path &file) const {
    auto it = getFileIteratorNoThrow(file);
    if (it == files.end()) {
        throw FileException(file, "Not found");
    }
    return it;
}